

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O3

Vector3f json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *c)

{
  const_reference pvVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RSI;
  ulong uVar2;
  Vector3f VVar3;
  float ret;
  float ret_1;
  float ret_2;
  float local_24;
  float local_20;
  float local_1c;
  
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](in_RSI,0);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar1,&local_24);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](in_RSI,1);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar1,&local_20);
  pvVar1 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::operator[](in_RSI,2);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_float,_0>
            (pvVar1,&local_1c);
  uVar2 = (ulong)(uint)local_24;
  Vector3f::Vector3f((Vector3f *)c,local_24,local_20,local_1c);
  VVar3.m_elements[2] = local_20;
  VVar3.m_elements[0] = (float)(int)uVar2;
  VVar3.m_elements[1] = (float)(int)(uVar2 >> 0x20);
  return (Vector3f)VVar3.m_elements;
}

Assistant:

Vector3f json_to_v3(const T& c)
{
	return Vector3f(c[0], c[1], c[2]);
}